

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int cm_zlib_deflateGetDictionary(z_streamp strm,Bytef *dictionary,uInt *dictLength)

{
  internal_state *piVar1;
  int iVar2;
  uint local_34;
  uInt len;
  deflate_state *s;
  uInt *dictLength_local;
  Bytef *dictionary_local;
  z_streamp strm_local;
  
  iVar2 = deflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    local_34 = piVar1->strstart + piVar1->lookahead;
    if (piVar1->w_size < local_34) {
      local_34 = piVar1->w_size;
    }
    if ((dictionary != (Bytef *)0x0) && (local_34 != 0)) {
      memcpy(dictionary,
             piVar1->window +
             (((ulong)piVar1->lookahead + (ulong)piVar1->strstart) - (ulong)local_34),
             (ulong)local_34);
    }
    if (dictLength != (uInt *)0x0) {
      *dictLength = local_34;
    }
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateGetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    Bytef *dictionary;
    uInt  *dictLength;
{
    deflate_state *s;
    uInt len;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;
    len = s->strstart + s->lookahead;
    if (len > s->w_size)
        len = s->w_size;
    if (dictionary != Z_NULL && len)
        zmemcpy(dictionary, s->window + s->strstart + s->lookahead - len, len);
    if (dictLength != Z_NULL)
        *dictLength = len;
    return Z_OK;
}